

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void get_min_bsize(SIMPLE_MOTION_DATA_TREE *sms_tree,int *min_bw,int *min_bh)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  
  if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    return;
  }
  BVar1 = sms_tree->block_size;
  if (BVar1 == BLOCK_4X4) {
    *min_bw = 0;
    uVar4 = 0;
  }
  else {
    bVar2 = sms_tree->partitioning;
    if (bVar2 == 0xff) {
      return;
    }
    if (bVar2 == 3) {
      lVar6 = 0;
      do {
        get_min_bsize(sms_tree->split[lVar6],min_bw,min_bh);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      return;
    }
    bVar3 = 3;
    if ((bVar2 & 0xfc) != 4) {
      bVar3 = bVar2;
    }
    if (bVar3 == 0xff) {
      return;
    }
    switch(BVar1) {
    case BLOCK_16X16:
      lVar6 = 2;
      break;
    case BLOCK_16X32:
    case BLOCK_32X16:
    case BLOCK_32X64:
    case BLOCK_64X32:
    case BLOCK_64X128:
    case BLOCK_128X64:
      return;
    case BLOCK_32X32:
      lVar6 = 3;
      break;
    case BLOCK_64X64:
      lVar6 = 4;
      break;
    case BLOCK_128X128:
      lVar6 = 5;
      break;
    default:
      lVar6 = 1;
      if (BVar1 != BLOCK_8X8) {
        return;
      }
    }
    uVar5 = (ulong)subsize_lookup[bVar3][lVar6];
    if (uVar5 == 0xff) {
      return;
    }
    uVar4 = (uint)""[uVar5];
    if (*min_bw < (int)(uint)""[uVar5]) {
      uVar4 = *min_bw;
    }
    *min_bw = uVar4;
    uVar4 = (uint)""[uVar5];
    if (*min_bh < (int)(uint)""[uVar5]) {
      uVar4 = *min_bh;
    }
  }
  *min_bh = uVar4;
  return;
}

Assistant:

static inline void get_min_bsize(const SIMPLE_MOTION_DATA_TREE *sms_tree,
                                 int *min_bw, int *min_bh) {
  if (!sms_tree) return;

  const BLOCK_SIZE bsize = sms_tree->block_size;
  if (bsize == BLOCK_4X4) {
    *min_bw = 0;
    *min_bh = 0;
    return;
  }

  PARTITION_TYPE part_type = sms_tree->partitioning;
  if (part_type == PARTITION_INVALID) return;

  if (part_type == PARTITION_SPLIT) {
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
      get_min_bsize(sms_tree->split[i], min_bw, min_bh);
    }
  } else {
    if (part_type == PARTITION_HORZ_A || part_type == PARTITION_HORZ_B ||
        part_type == PARTITION_VERT_A || part_type == PARTITION_VERT_B)
      part_type = PARTITION_SPLIT;
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, part_type);
    if (subsize != BLOCK_INVALID) {
      *min_bw = AOMMIN(*min_bw, mi_size_wide_log2[subsize]);
      *min_bh = AOMMIN(*min_bh, mi_size_high_log2[subsize]);
    }
  }
}